

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::SetTestLoad(cmCTestMultiProcessHandler *this,unsigned_long load)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  string fake_load_value;
  unsigned_long load_local;
  cmCTestMultiProcessHandler *this_local;
  
  this->TestLoad = load;
  fake_load_value.field_2._8_8_ = load;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = cmsys::SystemTools::GetEnv("__CTEST_FAKE_LOAD_AVERAGE_FOR_TESTING",(string *)local_38);
  if ((bVar1) && (bVar1 = cmStrToULong((string *)local_38,&this->FakeLoadForTesting), !bVar1)) {
    std::operator+(&local_68,"Failed to parse fake load value: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    cmSystemTools::Error(&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::SetTestLoad(unsigned long load)
{
  this->TestLoad = load;

  std::string fake_load_value;
  if (cmSystemTools::GetEnv("__CTEST_FAKE_LOAD_AVERAGE_FOR_TESTING",
                            fake_load_value)) {
    if (!cmStrToULong(fake_load_value, &this->FakeLoadForTesting)) {
      cmSystemTools::Error("Failed to parse fake load value: " +
                           fake_load_value);
    }
  }
}